

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall
Qentem::Array<Qentem::Value<char>_>::operator+=
          (Array<Qentem::Value<char>_> *this,Array<Qentem::Value<char>_> *src)

{
  SizeT SVar1;
  SizeT SVar2;
  uint new_size;
  Value<char> *pVVar3;
  Value<char> *from;
  SizeT n_size;
  SizeT32 type_size;
  Array<Qentem::Value<char>_> *src_local;
  Array<Qentem::Value<char>_> *this_local;
  
  SVar1 = Capacity(this);
  if (SVar1 == 0) {
    pVVar3 = Storage(src);
    setStorage(this,pVVar3);
    SVar1 = Size(src);
    setSize(this,SVar1);
    SVar1 = Capacity(src);
    setCapacity(this,SVar1);
  }
  else {
    SVar1 = Size(this);
    SVar2 = Size(src);
    new_size = SVar1 + SVar2;
    SVar1 = Capacity(this);
    if (SVar1 < new_size) {
      resize(this,new_size);
    }
    pVVar3 = Storage(this);
    SVar1 = Size(this);
    from = Storage(src);
    SVar2 = Size(src);
    Memory::Copy<unsigned_int>(pVVar3 + SVar1,from,SVar2 * 0x18);
    pVVar3 = Storage(src);
    Memory::Deallocate(pVVar3);
    setSize(this,new_size);
  }
  clearStorage(src);
  setSize(src,0);
  setCapacity(src,0);
  return;
}

Assistant:

void operator+=(Array &&src) {
        if (Capacity() == 0) {
            setStorage(src.Storage());
            setSize(src.Size());
            setCapacity(src.Capacity());
        } else {
            constexpr SizeT32 type_size = sizeof(Type_T);
            const SizeT       n_size    = (Size() + src.Size());

            if (n_size > Capacity()) {
                resize(n_size);
            }

            Memory::Copy((Storage() + Size()), src.Storage(), (src.Size() * type_size));
            Memory::Deallocate(src.Storage());
            setSize(n_size);
        }

        src.clearStorage();
        src.setSize(0);
        src.setCapacity(0);
    }